

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_shm.c
# Opt level: O0

QcShm * qc_shm_open(char *name,QcErr *err)

{
  int __fd;
  int iVar1;
  uint *puVar2;
  QcShm *qcShm;
  stat sb;
  char *addr;
  mode_t mode;
  int fd;
  int opt;
  int flags;
  QcErr *err_local;
  char *name_local;
  
  __fd = shm_open(name,2,0x180);
  if (__fd == -1) {
    puVar2 = (uint *)__errno_location();
    qc_seterr(err,-1,"shm_open failed, name : %s errno=%d\n",name,(ulong)*puVar2);
    name_local = (char *)0x0;
  }
  else {
    iVar1 = fstat(__fd,(stat *)&qcShm);
    if (iVar1 == -1) {
      puVar2 = (uint *)__errno_location();
      qc_seterr(err,-1,"fstat failed, errno=%d\n",(ulong)*puVar2);
      name_local = (char *)0x0;
    }
    else {
      sb.__glibc_reserved[2] = (__syscall_slong_t)mmap((void *)0x0,sb.st_rdev,3,1,__fd,0);
      if ((void *)sb.__glibc_reserved[2] == (void *)0xffffffffffffffff) {
        puVar2 = (uint *)__errno_location();
        qc_seterr(err,-1,"mmap faied, errno=%d\n",(ulong)*puVar2);
        name_local = (char *)0x0;
      }
      else {
        close(__fd);
        name_local = (char *)malloc(0x98);
        if (name_local == (char *)0x0) {
          fprintf(_stderr,"malloc failed. [%s  line:%d]\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_shm.c"
                  ,0x83);
          __assert_fail("qcShm",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_shm.c"
                        ,0x83,"QcShm *qc_shm_open(const char *, QcErr *)");
        }
        memset(name_local,0,0x98);
        strncpy(name_local,name,0x80);
        *(__syscall_slong_t *)(name_local + 0x88) = sb.__glibc_reserved[2];
        *(__dev_t *)(name_local + 0x90) = sb.st_rdev;
      }
    }
  }
  return (QcShm *)name_local;
}

Assistant:

QcShm* qc_shm_open(const char *name, QcErr *err)
{
    int flags, opt, fd;
    mode_t mode;
    char *addr;
    struct stat sb;

    flags = O_RDWR;  //just open
    mode  = S_IRUSR|S_IWUSR;

    fd = shm_open(name, flags, mode);
    if(fd == -1)
    {
        qc_seterr(err, -1, "shm_open failed, name : %s errno=%d\n", name, errno);
        return NULL;
    }

    if(fstat(fd, &sb) == -1)
    {
        qc_seterr(err, -1, "fstat failed, errno=%d\n", errno);
        return NULL;
    }

    addr = mmap(NULL, sb.st_size, PROT_READ|PROT_WRITE, MAP_SHARED, fd, 0);
    if(addr == MAP_FAILED)
    {
        qc_seterr(err, -1, "mmap faied, errno=%d\n", errno);
        return NULL;
    }

    close(fd);

    QcShm *qcShm;
    qc_malloc(qcShm, sizeof(QcShm));
    strncpy(qcShm->name, name, QC_SHMNAME_MAXLEN);
    qcShm->shmaddr = addr;
    qcShm->shmsize = sb.st_size;

    return qcShm;
}